

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localpointer.h
# Opt level: O0

void __thiscall
icu_63::LocalPointer<icu_63::number::impl::DecimalFormatProperties>::adoptInsteadAndCheckErrorCode
          (LocalPointer<icu_63::number::impl::DecimalFormatProperties> *this,
          DecimalFormatProperties *p,UErrorCode *errorCode)

{
  DecimalFormatProperties *this_00;
  UBool UVar1;
  DecimalFormatProperties *p_00;
  UErrorCode *errorCode_local;
  DecimalFormatProperties *p_local;
  LocalPointer<icu_63::number::impl::DecimalFormatProperties> *this_local;
  
  p_00 = p;
  UVar1 = ::U_SUCCESS(*errorCode);
  if (UVar1 == '\0') {
    if (p != (DecimalFormatProperties *)0x0) {
      icu_63::number::impl::DecimalFormatProperties::~DecimalFormatProperties(p);
      UMemory::operator_delete((UMemory *)p,p_00);
    }
  }
  else {
    this_00 = (this->super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>).ptr;
    if (this_00 != (DecimalFormatProperties *)0x0) {
      icu_63::number::impl::DecimalFormatProperties::~DecimalFormatProperties(this_00);
      UMemory::operator_delete((UMemory *)this_00,p_00);
    }
    (this->super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>).ptr = p;
    if (p == (DecimalFormatProperties *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return;
}

Assistant:

void adoptInsteadAndCheckErrorCode(T *p, UErrorCode &errorCode) {
        if(U_SUCCESS(errorCode)) {
            delete LocalPointerBase<T>::ptr;
            LocalPointerBase<T>::ptr=p;
            if(p==NULL) {
                errorCode=U_MEMORY_ALLOCATION_ERROR;
            }
        } else {
            delete p;
        }
    }